

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress.c
# Opt level: O1

size_t enet_range_coder_compress
                 (void *context,ENetBuffer *inBuffers,size_t inBufferCount,size_t inLimit,
                 enet_uint8 *outData,size_t outLimit)

{
  byte bVar1;
  byte bVar2;
  undefined4 uVar3;
  enet_uint16 eVar4;
  int iVar5;
  int iVar6;
  ushort *puVar7;
  undefined1 (*pauVar8) [16];
  undefined1 (*pauVar9) [16];
  ushort uVar10;
  short sVar11;
  ushort uVar12;
  uint uVar13;
  uint uVar14;
  ushort uVar15;
  uint uVar16;
  ulong uVar17;
  undefined1 (*pauVar18) [16];
  ulong uVar19;
  ulong uVar20;
  byte *pbVar21;
  ulong uVar22;
  ulong uVar23;
  enet_uint8 *peVar24;
  enet_uint16 predicted;
  ushort local_82;
  ulong local_80;
  long local_78;
  byte *local_70;
  undefined1 (*local_68) [16];
  ENetBuffer *local_60;
  byte *local_58;
  enet_uint8 *local_50;
  ulong local_48;
  undefined1 (*local_40) [16];
  ulong local_38;
  
  local_82 = 0;
  uVar23 = 0;
  if (inLimit != 0 && (inBufferCount != 0 && context != (void *)0x0)) {
    peVar24 = outData + outLimit;
    pbVar21 = (byte *)inBuffers->data;
    local_58 = pbVar21 + inBuffers->dataLength;
    local_60 = inBuffers + 1;
    local_78 = inBufferCount - 1;
    *(undefined1 (*) [16])context = (undefined1  [16])0x0;
    *(undefined2 *)((long)context + 0xc) = 0x101;
    *(undefined4 *)((long)context + 8) = 0x10000;
    uVar19 = 1;
    uVar17 = 0xffffffff;
    local_80 = 0;
    local_68 = (undefined1 (*) [16])context;
    local_50 = outData;
    do {
      iVar5 = (int)uVar23;
      if (pbVar21 < local_58) {
LAB_00102658:
        bVar1 = *pbVar21;
        pbVar21 = pbVar21 + 1;
        if (local_82 == 0) {
          puVar7 = &local_82;
        }
        else {
          puVar7 = &local_82;
          uVar10 = local_82;
          do {
            pauVar8 = (undefined1 (*) [16])((long)context + (ulong)uVar10 * 0x10);
            uVar15 = *(ushort *)(*(undefined1 (*) [16])((long)context + (ulong)uVar10 * 0x10) + 8);
            if (uVar15 == 0) {
              uVar20 = uVar19 + 1;
              pauVar9 = (undefined1 (*) [16])((long)context + uVar19 * 0x10);
              (*(undefined1 (*) [16])((long)context + uVar19 * 0x10))[0] = bVar1;
              (*(undefined1 (*) [16])((long)context + uVar19 * 0x10))[1] = 2;
              *(undefined2 *)(*(undefined1 (*) [16])((long)context + uVar19 * 0x10) + 2) = 2;
              *(undefined8 *)(*(undefined1 (*) [16])((long)context + uVar19 * 0x10) + 4) = 0;
              *(undefined4 *)(*(undefined1 (*) [16])((long)context + uVar19 * 0x10) + 0xc) = 0;
              *(short *)(*(undefined1 (*) [16])((long)context + (ulong)uVar10 * 0x10) + 8) =
                   (short)((int)uVar19 * 0x10 + (uint)uVar10 * -0x10 >> 4);
              uVar22 = 0;
              uVar13 = 0;
            }
            else {
              uVar10 = 0;
              pauVar18 = pauVar8;
              do {
                bVar2 = pauVar18[uVar15][0];
                pauVar18 = pauVar18 + uVar15;
                while (bVar1 < bVar2) {
                  *(short *)(*pauVar18 + 2) = *(short *)(*pauVar18 + 2) + 2;
                  uVar15 = *(ushort *)(*pauVar18 + 4);
                  if (uVar15 == 0) {
                    uVar20 = uVar19 + 1;
                    pauVar9 = (undefined1 (*) [16])((long)context + uVar19 * 0x10);
                    (*(undefined1 (*) [16])((long)context + uVar19 * 0x10))[0] = bVar1;
                    (*(undefined1 (*) [16])((long)context + uVar19 * 0x10))[1] = 2;
                    *(undefined2 *)(*(undefined1 (*) [16])((long)context + uVar19 * 0x10) + 2) = 2;
                    *(undefined8 *)(*(undefined1 (*) [16])((long)context + uVar19 * 0x10) + 4) = 0;
                    *(undefined4 *)(*(undefined1 (*) [16])((long)context + uVar19 * 0x10) + 0xc) = 0
                    ;
                    *(short *)(*pauVar18 + 4) = (short)((uint)((int)pauVar9 - (int)pauVar18) >> 4);
                    uVar22 = 0;
                    goto LAB_00102778;
                  }
                  bVar2 = pauVar18[uVar15][0];
                  pauVar18 = pauVar18 + uVar15;
                }
                if (bVar1 <= bVar2) {
                  bVar2 = (*pauVar18)[1];
                  uVar22 = (ulong)bVar2;
                  uVar10 = (uVar10 - bVar2) + *(short *)(*pauVar18 + 2);
                  *(short *)(*pauVar18 + 2) = *(short *)(*pauVar18 + 2) + 2;
                  (*pauVar18)[1] = bVar2 + 2;
                  pauVar9 = pauVar18;
                  uVar20 = uVar19;
                  goto LAB_00102778;
                }
                uVar10 = uVar10 + *(short *)(*pauVar18 + 2);
                uVar15 = *(ushort *)(*pauVar18 + 6);
              } while (uVar15 != 0);
              (*(undefined1 (*) [16])((long)context + uVar19 * 0x10))[0] = bVar1;
              (*(undefined1 (*) [16])((long)context + uVar19 * 0x10))[1] = 2;
              *(undefined2 *)(*(undefined1 (*) [16])((long)context + uVar19 * 0x10) + 2) = 2;
              *(undefined8 *)(*(undefined1 (*) [16])((long)context + uVar19 * 0x10) + 4) = 0;
              *(undefined4 *)(*(undefined1 (*) [16])((long)context + uVar19 * 0x10) + 0xc) = 0;
              *(short *)(*pauVar18 + 6) =
                   (short)((uint)((int)(undefined1 (*) [16])((long)context + uVar19 * 0x10) -
                                 (int)pauVar18) >> 4);
              uVar22 = 0;
              pauVar9 = (undefined1 (*) [16])((long)context + uVar19 * 0x10);
              uVar20 = uVar19 + 1;
LAB_00102778:
              uVar13 = (uint)uVar10;
            }
            *puVar7 = (ushort)((uint)((int)pauVar9 - (int)context) >> 4);
            uVar10 = *(ushort *)(*pauVar8 + 0xc);
            uVar14 = (uint)uVar22;
            if (uVar14 != 0) {
              iVar5 = (int)(uVar17 / uVar10);
              uVar13 = (uVar13 + *(ushort *)(*pauVar8 + 10)) * iVar5 + (int)uVar23;
              uVar16 = iVar5 * uVar14;
              do {
                uVar23 = (ulong)uVar13;
                uVar17 = (ulong)uVar16;
                if (0xffffff < (uVar16 + uVar13 ^ uVar13)) {
                  if (0xffff < uVar16) goto LAB_001028a9;
                  uVar17 = (ulong)(-uVar13 & 0xffff);
                }
                if (peVar24 <= outData) goto LAB_00102b1f;
                *outData = (enet_uint8)(uVar13 >> 0x18);
                outData = outData + 1;
                uVar16 = (int)uVar17 << 8;
                uVar13 = uVar13 << 8;
              } while( true );
            }
            uVar15 = *(ushort *)(*pauVar8 + 10);
            if (uVar15 < uVar10 && uVar15 != 0) {
              uVar13 = (int)(uVar17 / uVar10) * (uint)uVar15;
              do {
                uVar17 = (ulong)uVar13;
                uVar16 = (uint)uVar23;
                if (0xffffff < (uVar13 + uVar16 ^ uVar16)) {
                  if (0xffff < uVar13) break;
                  uVar17 = (ulong)(-uVar16 & 0xffff);
                }
                if (peVar24 <= outData) goto LAB_00102b1f;
                *outData = (enet_uint8)(uVar23 >> 0x18);
                outData = outData + 1;
                uVar13 = (int)uVar17 << 8;
                uVar23 = (ulong)(uVar16 << 8);
              } while( true );
            }
            uVar3 = *(undefined4 *)(*pauVar8 + 10);
            *(short *)(*pauVar8 + 10) = (short)uVar3 + 5;
            *(short *)(*pauVar8 + 0xc) = (short)((uint)uVar3 >> 0x10) + 5;
LAB_001028a9:
            iVar5 = (int)uVar23;
            uVar10 = *(short *)(*pauVar8 + 0xc) + 2;
            *(ushort *)(*pauVar8 + 0xc) = uVar10;
            if ((0xfb < uVar14) || (uVar19 = uVar20, 0xff00 < uVar10)) {
              local_38 = uVar20;
              if (*(ushort *)(*pauVar8 + 8) == 0) {
                eVar4 = 0;
              }
              else {
                local_70 = pbVar21;
                local_48 = uVar22;
                local_40 = pauVar8;
                eVar4 = enet_symbol_rescale((ENetSymbol *)(pauVar8 + *(ushort *)(*pauVar8 + 8)));
                pbVar21 = local_70;
                pauVar8 = local_40;
                context = local_68;
                uVar22 = local_48;
              }
              sVar11 = *(ushort *)(*pauVar8 + 10) - (*(ushort *)(*pauVar8 + 10) >> 1);
              *(short *)(*pauVar8 + 10) = sVar11;
              *(enet_uint16 *)(*pauVar8 + 0xc) = sVar11 + eVar4;
              uVar19 = local_38;
            }
            if (0 < (int)uVar22) goto LAB_00102b9b;
            puVar7 = (ushort *)(*pauVar9 + 0xe);
            uVar10 = *(ushort *)(*pauVar8 + 0xe);
          } while (uVar10 != 0);
        }
        uVar12 = (ushort)bVar1;
        uVar10 = *(ushort *)(*(undefined1 (*) [16])context + 8);
        pauVar8 = (undefined1 (*) [16])context;
        uVar15 = (ushort)bVar1;
        if (uVar10 == 0) {
          (*(undefined1 (*) [16])((long)context + uVar19 * 0x10))[0] = bVar1;
          (*(undefined1 (*) [16])((long)context + uVar19 * 0x10))[1] = 3;
          *(undefined2 *)(*(undefined1 (*) [16])((long)context + uVar19 * 0x10) + 2) = 3;
          *(undefined8 *)(*(undefined1 (*) [16])((long)context + uVar19 * 0x10) + 4) = 0;
          *(undefined4 *)(*(undefined1 (*) [16])((long)context + uVar19 * 0x10) + 0xc) = 0;
          *(short *)(*(undefined1 (*) [16])context + 8) = (short)uVar19;
          pauVar9 = (undefined1 (*) [16])((long)context + uVar19 * 0x10);
          uVar13 = 1;
          uVar19 = uVar19 + 1;
        }
        else {
          do {
            uVar12 = uVar15;
            bVar2 = pauVar8[uVar10][0];
            pauVar8 = pauVar8 + uVar10;
            while (bVar1 < bVar2) {
              *(short *)(*pauVar8 + 2) = *(short *)(*pauVar8 + 2) + 3;
              uVar10 = *(ushort *)(*pauVar8 + 4);
              if (uVar10 == 0) {
                pauVar9 = (undefined1 (*) [16])((long)context + uVar19 * 0x10);
                (*(undefined1 (*) [16])((long)context + uVar19 * 0x10))[0] = bVar1;
                (*(undefined1 (*) [16])((long)context + uVar19 * 0x10))[1] = 3;
                *(undefined2 *)(*(undefined1 (*) [16])((long)context + uVar19 * 0x10) + 2) = 3;
                *(undefined8 *)(*(undefined1 (*) [16])((long)context + uVar19 * 0x10) + 4) = 0;
                *(undefined4 *)(*(undefined1 (*) [16])((long)context + uVar19 * 0x10) + 0xc) = 0;
                *(short *)(*pauVar8 + 4) = (short)((uint)((int)pauVar9 - (int)pauVar8) >> 4);
                uVar13 = 1;
                uVar19 = uVar19 + 1;
                goto LAB_00102ab7;
              }
              bVar2 = pauVar8[uVar10][0];
              pauVar8 = pauVar8 + uVar10;
            }
            if (bVar1 <= bVar2) {
              bVar1 = (*pauVar8)[1];
              uVar13 = bVar1 + 1;
              uVar12 = (uVar12 - bVar1) + *(short *)(*pauVar8 + 2);
              *(short *)(*pauVar8 + 2) = *(short *)(*pauVar8 + 2) + 3;
              (*pauVar8)[1] = bVar1 + 3;
              pauVar9 = pauVar8;
              local_70 = pbVar21;
              goto LAB_00102ab7;
            }
            uVar12 = uVar12 + *(short *)(*pauVar8 + 2);
            uVar10 = *(ushort *)(*pauVar8 + 6);
            uVar15 = uVar12;
          } while (uVar10 != 0);
          (*(undefined1 (*) [16])((long)context + uVar19 * 0x10))[0] = bVar1;
          (*(undefined1 (*) [16])((long)context + uVar19 * 0x10))[1] = 3;
          *(undefined2 *)(*(undefined1 (*) [16])((long)context + uVar19 * 0x10) + 2) = 3;
          *(undefined8 *)(*(undefined1 (*) [16])((long)context + uVar19 * 0x10) + 4) = 0;
          *(undefined4 *)(*(undefined1 (*) [16])((long)context + uVar19 * 0x10) + 0xc) = 0;
          *(short *)(*pauVar8 + 6) =
               (short)((uint)((int)(undefined1 (*) [16])((long)context + uVar19 * 0x10) -
                             (int)pauVar8) >> 4);
          uVar13 = 1;
          pauVar9 = (undefined1 (*) [16])((long)context + uVar19 * 0x10);
          uVar19 = uVar19 + 1;
        }
LAB_00102ab7:
        *puVar7 = (ushort)((uint)((int)pauVar9 - (int)context) >> 4);
        iVar6 = (int)(uVar17 / *(ushort *)(*(undefined1 (*) [16])context + 0xc));
        uVar14 = ((uint)uVar12 + (uint)*(ushort *)(*(undefined1 (*) [16])context + 10)) * iVar6 +
                 iVar5;
        uVar16 = iVar6 * uVar13;
LAB_00102ae7:
        uVar23 = (ulong)uVar14;
        uVar17 = (ulong)uVar16;
        if ((uVar16 + uVar14 ^ uVar14) < 0x1000000) {
LAB_00102b05:
          uVar20 = uVar19;
          if (outData < peVar24) goto code_r0x00102b0a;
LAB_00102b1f:
          iVar5 = 1;
          uVar19 = uVar20;
        }
        else {
          if (uVar16 < 0x10000) {
            uVar17 = (ulong)(-uVar14 & 0xffff);
            goto LAB_00102b05;
          }
          uVar10 = *(short *)(*(undefined1 (*) [16])context + 0xc) + 3;
          *(ushort *)(*(undefined1 (*) [16])context + 0xc) = uVar10;
          if (0xff00 < uVar10 || 0xfa < uVar13) {
            if (*(ushort *)(*(undefined1 (*) [16])context + 8) == 0) {
              eVar4 = 0;
            }
            else {
              eVar4 = enet_symbol_rescale((ENetSymbol *)
                                          ((long)context +
                                          (ulong)*(ushort *)(*(undefined1 (*) [16])context + 8) *
                                          0x10));
              context = local_68;
            }
            sVar11 = *(ushort *)(*(undefined1 (*) [16])context + 10) -
                     (*(ushort *)(*(undefined1 (*) [16])context + 10) >> 1);
            *(short *)(*(undefined1 (*) [16])context + 10) = sVar11;
            *(enet_uint16 *)(*(undefined1 (*) [16])context + 0xc) = eVar4 + sVar11 + 0x100;
          }
LAB_00102b9b:
          if (local_80 < 2) {
            local_80 = local_80 + 1;
          }
          else {
            local_82 = *(ushort *)
                        (*(undefined1 (*) [16])((long)context + (ulong)local_82 * 0x10) + 0xe);
            local_80 = 2;
          }
          iVar5 = 0;
          if (0xffd < uVar19) {
            *(undefined1 (*) [16])context = (undefined1  [16])0x0;
            *(undefined2 *)(*(undefined1 (*) [16])context + 0xc) = 0x101;
            *(undefined4 *)(*(undefined1 (*) [16])context + 8) = 0x10000;
            local_82 = 0;
            local_80 = 0;
            uVar19 = 1;
            iVar5 = 0;
          }
        }
        goto LAB_00102b24;
      }
      if (local_78 != 0) {
        pbVar21 = (byte *)local_60->data;
        local_58 = pbVar21 + local_60->dataLength;
        local_60 = local_60 + 1;
        local_78 = local_78 + -1;
        goto LAB_00102658;
      }
      iVar5 = 2;
      local_78 = 0;
LAB_00102b24:
    } while (iVar5 == 0);
    if (iVar5 == 2) {
      uVar13 = (uint)uVar23;
      while( true ) {
        if (uVar13 == 0) {
          return (long)outData - (long)local_50;
        }
        if (peVar24 <= outData) break;
        *outData = (enet_uint8)(uVar23 >> 0x18);
        outData = outData + 1;
        uVar13 = (int)uVar23 << 8;
        uVar23 = (ulong)uVar13;
      }
    }
  }
  return 0;
code_r0x00102b0a:
  *outData = (enet_uint8)(uVar14 >> 0x18);
  outData = outData + 1;
  uVar16 = (int)uVar17 << 8;
  uVar14 = uVar14 << 8;
  goto LAB_00102ae7;
}

Assistant:

size_t
enet_range_coder_compress (void * context, const ENetBuffer * inBuffers, size_t inBufferCount, size_t inLimit, enet_uint8 * outData, size_t outLimit)
{
    ENetRangeCoder * rangeCoder = (ENetRangeCoder *) context;
    enet_uint8 * outStart = outData, * outEnd = & outData [outLimit];
    const enet_uint8 * inData, * inEnd;
    enet_uint32 encodeLow = 0, encodeRange = ~0;
    ENetSymbol * root;
    enet_uint16 predicted = 0;
    size_t order = 0, nextSymbol = 0;

    if (rangeCoder == NULL || inBufferCount <= 0 || inLimit <= 0)
      return 0;

    inData = (const enet_uint8 *) inBuffers -> data;
    inEnd = & inData [inBuffers -> dataLength];
    inBuffers ++;
    inBufferCount --;

    ENET_CONTEXT_CREATE (root, ENET_CONTEXT_ESCAPE_MINIMUM, ENET_CONTEXT_SYMBOL_MINIMUM);

    for (;;)
    {
        ENetSymbol * subcontext, * symbol;
#ifdef ENET_CONTEXT_EXCLUSION
        const ENetSymbol * childContext = & emptyContext;
#endif
        enet_uint8 value;
        enet_uint16 count, under, * parent = & predicted, total;
        if (inData >= inEnd)
        {
            if (inBufferCount <= 0)
              break;
            inData = (const enet_uint8 *) inBuffers -> data;
            inEnd = & inData [inBuffers -> dataLength];
            inBuffers ++;
            inBufferCount --;
        }
        value = * inData ++;
    
        for (subcontext = & rangeCoder -> symbols [predicted]; 
             subcontext != root; 
#ifdef ENET_CONTEXT_EXCLUSION
             childContext = subcontext, 
#endif
                subcontext = & rangeCoder -> symbols [subcontext -> parent])
        {
            ENET_CONTEXT_ENCODE (subcontext, symbol, value, under, count, ENET_SUBCONTEXT_SYMBOL_DELTA, 0);
            * parent = symbol - rangeCoder -> symbols;
            parent = & symbol -> parent;
            total = subcontext -> total;
#ifdef ENET_CONTEXT_EXCLUSION
            if (childContext -> total > ENET_SUBCONTEXT_SYMBOL_DELTA + ENET_SUBCONTEXT_ESCAPE_DELTA)
              ENET_CONTEXT_ENCODE_EXCLUDE (childContext, value, under, total, 0);
#endif
            if (count > 0)
            {
                ENET_RANGE_CODER_ENCODE (subcontext -> escapes + under, count, total);
            }
            else
            {
                if (subcontext -> escapes > 0 && subcontext -> escapes < total) 
                    ENET_RANGE_CODER_ENCODE (0, subcontext -> escapes, total); 
                subcontext -> escapes += ENET_SUBCONTEXT_ESCAPE_DELTA;
                subcontext -> total += ENET_SUBCONTEXT_ESCAPE_DELTA;
            }
            subcontext -> total += ENET_SUBCONTEXT_SYMBOL_DELTA;
            if (count > 0xFF - 2*ENET_SUBCONTEXT_SYMBOL_DELTA || subcontext -> total > ENET_RANGE_CODER_BOTTOM - 0x100)
              ENET_CONTEXT_RESCALE (subcontext, 0);
            if (count > 0) goto nextInput;
        }

        ENET_CONTEXT_ENCODE (root, symbol, value, under, count, ENET_CONTEXT_SYMBOL_DELTA, ENET_CONTEXT_SYMBOL_MINIMUM);
        * parent = symbol - rangeCoder -> symbols;
        parent = & symbol -> parent;
        total = root -> total;
#ifdef ENET_CONTEXT_EXCLUSION
        if (childContext -> total > ENET_SUBCONTEXT_SYMBOL_DELTA + ENET_SUBCONTEXT_ESCAPE_DELTA)
          ENET_CONTEXT_ENCODE_EXCLUDE (childContext, value, under, total, ENET_CONTEXT_SYMBOL_MINIMUM); 
#endif
        ENET_RANGE_CODER_ENCODE (root -> escapes + under, count, total);
        root -> total += ENET_CONTEXT_SYMBOL_DELTA; 
        if (count > 0xFF - 2*ENET_CONTEXT_SYMBOL_DELTA + ENET_CONTEXT_SYMBOL_MINIMUM || root -> total > ENET_RANGE_CODER_BOTTOM - 0x100)
          ENET_CONTEXT_RESCALE (root, ENET_CONTEXT_SYMBOL_MINIMUM);

    nextInput:
        if (order >= ENET_SUBCONTEXT_ORDER) 
          predicted = rangeCoder -> symbols [predicted].parent;
        else 
          order ++;
        ENET_RANGE_CODER_FREE_SYMBOLS;
    }

    ENET_RANGE_CODER_FLUSH;

    return (size_t) (outData - outStart);
}